

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

CType google::protobuf::compiler::cpp::EffectiveStringCType(FieldDescriptor *field,Options *options)

{
  CppType CVar1;
  LogMessage *other;
  FieldOptions *this;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_20 = options;
  options_local = (Options *)field;
  CVar1 = FieldDescriptor::cpp_type(field);
  local_59 = 0;
  if (CVar1 != CPPTYPE_STRING) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x3e0);
    local_59 = 1;
    other = internal::LogMessage::operator<<
                      (&local_58,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_STRING: ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if ((local_20->opensource_runtime & 1U) == 0) {
    this = FieldDescriptor::options((FieldDescriptor *)options_local);
    field_local._4_4_ = FieldOptions::ctype(this);
  }
  else {
    field_local._4_4_ = FieldOptions_CType_STRING;
  }
  return field_local._4_4_;
}

Assistant:

FieldOptions::CType EffectiveStringCType(const FieldDescriptor* field,
                                         const Options& options) {
  GOOGLE_DCHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  if (options.opensource_runtime) {
    // Open-source protobuf release only supports STRING ctype.
    return FieldOptions::STRING;
  } else {
    // Google-internal supports all ctypes.
    return field->options().ctype();
  }
}